

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTSoundBank_GetState(FACTSoundBank *pSoundBank,uint32_t *pdwState)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *pdwState = 0;
    uVar2 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    *pdwState = 4;
    uVar3 = 0xffffffffffffffff;
    lVar4 = 0x13;
    do {
      uVar3 = uVar3 + 1;
      if (pSoundBank->cueCount <= uVar3) goto LAB_0010bd38;
      puVar1 = &pSoundBank->cues->flags + lVar4;
      lVar4 = lVar4 + 0x14;
    } while (*puVar1 == '\0');
    *pdwState = 0x84;
LAB_0010bd38:
    FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t FACTSoundBank_GetState(
	FACTSoundBank *pSoundBank,
	uint32_t *pdwState
) {
	uint16_t i;
	if (pSoundBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pSoundBank->cueCount; i += 1)
	{
		if (pSoundBank->cues[i].instanceCount > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pSoundBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}